

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O0

void QComboBoxDelegate::setSeparator(QAbstractItemModel *model,QModelIndex *index)

{
  QStandardItemModel *pQVar1;
  QFlags_conflict1 *pQVar2;
  char (*in_RSI) [10];
  QFlags<Qt::ItemFlag> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QStandardItem *item;
  QStandardItemModel *m;
  QFlagsStorage<Qt::ItemFlag> other;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  storage_type *local_50;
  undefined1 local_40 [24];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<10ul>
            ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RSI)
  ;
  QVar3.m_data = local_50;
  QVar3.m_size = (qsizetype)local_40;
  QString::fromLatin1(QVar3);
  ::QVariant::QVariant(&local_28,(QString *)local_40);
  (**(code **)(*(long *)in_RDI + 0x98))(in_RDI,in_RSI,&local_28,0xc);
  other.i = (Int)in_RSI;
  ::QVariant::~QVariant(&local_28);
  QString::~QString((QString *)0x543cdf);
  pQVar1 = qobject_cast<QStandardItemModel*>((QObject *)0x543ce9);
  if ((pQVar1 != (QStandardItemModel *)0x0) &&
     (pQVar2 = (QFlags_conflict1 *)QStandardItemModel::itemFromIndex((QModelIndex *)pQVar1),
     pQVar2 != (QFlags_conflict1 *)0x0)) {
    QStandardItem::flags();
    Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
    QFlags<Qt::ItemFlag>::operator~(in_RDI);
    QFlags<Qt::ItemFlag>::operator&(in_RDI,(QFlags<Qt::ItemFlag>)other.i);
    QStandardItem::setFlags(pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void setSeparator(QAbstractItemModel *model, const QModelIndex &index) {
        model->setData(index, QString::fromLatin1("separator"), Qt::AccessibleDescriptionRole);
        if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(model))
            if (QStandardItem *item = m->itemFromIndex(index))
                item->setFlags(item->flags() & ~(Qt::ItemIsSelectable|Qt::ItemIsEnabled));
    }